

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O0

void __thiscall EventLoop::EventLoop(EventLoop *this)

{
  bool bVar1;
  int iVar2;
  log_level lVar3;
  Epoll *this_00;
  id iVar4;
  Logger *pLVar5;
  element_type *this_01;
  anon_class_8_1_8991fb9c local_48;
  EventCallback local_40;
  EventLoop *local_10;
  EventLoop *this_local;
  
  local_10 = this;
  this_00 = (Epoll *)operator_new(0x88);
  Epoll::Epoll(this_00);
  std::shared_ptr<Epoll>::shared_ptr<Epoll,void>(&this->el_epoller,this_00);
  this->el_quit = false;
  iVar4 = std::this_thread::get_id();
  (this->el_tid)._M_thread = iVar4._M_thread;
  std::mutex::mutex(&this->el_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&this->el_task_funcs);
  this->el_dealing_task_funcs = false;
  iVar2 = eventfd(0,0x80800);
  this->el_evfd = iVar2;
  if (-1 < this->el_evfd) {
    pLVar5 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar5);
    if ((!bVar1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","EventLoop",0x13);
    }
    lVar3 = Logger::get_log_level();
    if (1 < (int)lVar3) {
      pLVar5 = Logger::get_instance();
      Logger::write_log(pLVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                        ,"EventLoop",0x13,LOG_LEVEL_INFO,"create one eventloop, event fd is %d\n",
                        this->el_evfd);
      pLVar5 = Logger::get_instance();
      Logger::flush(pLVar5);
    }
    this_01 = std::__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         this);
    iVar2 = this->el_evfd;
    local_48.this = this;
    std::function<void()>::function<EventLoop::EventLoop()::__0,void>
              ((function<void()> *)&local_40,&local_48);
    Epoll::epoll_add(this_01,iVar2,1,&local_40);
    std::function<void_()>::~function(&local_40);
    return;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] fail to create event_fd\n","error","EventLoop",0x10);
  }
  exit(1);
}

Assistant:

EventLoop::EventLoop() : el_epoller(new Epoll()) {
    if(el_evfd = { eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC) }; el_evfd < 0)
    {
        PR_ERROR("fail to create event_fd\n");
        exit(1);
    }
LOG_INFO("create one eventloop, event fd is %d\n", el_evfd);
    el_epoller->epoll_add(el_evfd, EPOLLIN /*| EPOLLET*/, [this](){ this->evfd_read(); });
}